

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O3

int nn_timerset_timeout(nn_timerset *self)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 local_14;
  
  iVar1 = nn_list_empty(&self->timeouts);
  local_14 = -1;
  if (iVar1 == 0) {
    nn_timerset_timeout_cold_1();
    local_14 = (int)((ulong)in_RAX >> 0x20);
  }
  return local_14;
}

Assistant:

int nn_timerset_timeout (struct nn_timerset *self)
{
    int timeout;

    if (nn_fast (nn_list_empty (&self->timeouts)))
        return -1;

    timeout = (int) (nn_cont (nn_list_begin (&self->timeouts),
        struct nn_timerset_hndl, list)->timeout - nn_clock_ms());
    return timeout < 0 ? 0 : timeout;
}